

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O0

void __thiscall
VectorSUnitTest_element_access_at_Test::TestBody(VectorSUnitTest_element_access_at_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  const_reference pvVar4;
  AssertHelper local_340;
  Message local_338 [2];
  out_of_range *anon_var_0_1;
  type e_1;
  undefined1 auStack_2f8 [7];
  bool gtest_caught_expected_1;
  TrueWithString gtest_msg_1;
  AssertHelper local_2d0;
  Message local_2c8;
  uint local_2bc;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_9;
  Message local_2a0;
  uint local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_8;
  Message local_278;
  uint local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_7;
  Message local_250;
  uint local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_6;
  Message local_228;
  uint local_21c;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_5;
  initializer_list<unsigned_int> local_1e8;
  undefined1 local_1d8 [8];
  vector_s<unsigned_int,_5UL> vc;
  Message local_1a8 [2];
  out_of_range *anon_var_0;
  type e;
  undefined1 auStack_168 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  AssertHelper local_140;
  Message local_138;
  uint local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_4;
  Message local_110;
  uint local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_3;
  Message local_e8;
  uint local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  Message local_c0;
  uint local_b4;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98 [3];
  uint local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  initializer_list<unsigned_int> local_48;
  undefined1 local_38 [8];
  vector_s<unsigned_int,_5UL> v;
  VectorSUnitTest_element_access_at_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x100000000;
  local_48._M_array = (iterator)&gtest_ar.message_;
  local_48._M_len = 5;
  v.data_ptr_ = (pointer)this;
  estl::vector_s<unsigned_int,_5UL>::vector_s((vector_s<unsigned_int,_5UL> *)local_38,&local_48);
  local_7c = 0;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_38,0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_78,"0u","v.at(0)",&local_7c,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x150,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_b4 = 1;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_38,1);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_b0,"1u","v.at(1)",&local_b4,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x151,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_dc = 2;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_38,2);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_d8,"2u","v.at(2)",&local_dc,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x152,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_104 = 3;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_38,3);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_100,"3u","v.at(3)",&local_104,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x153,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_12c = 4;
  pvVar2 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_38,4);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_128,"4u","v.at(4)",&local_12c,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x154,pcVar3);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_168[0] = (_Alloc_hider)0x0;
  stack0xfffffffffffffe99 = 0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_168);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_168);
  if (bVar1) {
    e._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_38,5);
    }
    if ((e._7_1_ & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)auStack_168,
                 "Expected: v.at(5) throws an exception of type std::out_of_range.\n  Actual: it throws nothing."
                );
      goto LAB_00123600;
    }
  }
  else {
LAB_00123600:
    testing::Message::Message(local_1a8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vc.data_ptr_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x155,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vc.data_ptr_,local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vc.data_ptr_);
    testing::Message::~Message(local_1a8);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_168);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x100000000;
  local_1e8._M_array = (iterator)&gtest_ar_5.message_;
  local_1e8._M_len = 5;
  estl::vector_s<unsigned_int,_5UL>::vector_s((vector_s<unsigned_int,_5UL> *)local_1d8,&local_1e8);
  local_21c = 0;
  pvVar4 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_1d8,0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_218,"0u","vc.at(0)",&local_21c,pvVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x159,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  local_244 = 1;
  pvVar4 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_1d8,1);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_240,"1u","vc.at(1)",&local_244,pvVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x15a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  local_26c = 2;
  pvVar4 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_1d8,2);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_268,"2u","vc.at(2)",&local_26c,pvVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x15b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  local_294 = 3;
  pvVar4 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_1d8,3);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_290,"3u","vc.at(3)",&local_294,pvVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x15c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  local_2bc = 4;
  pvVar4 = estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_1d8,4);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_2b8,"4u","vc.at(4)",&local_2bc,pvVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x15d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  gtest_msg_1.value._M_string_length = 0;
  gtest_msg_1.value.field_2._M_allocated_capacity = 0;
  auStack_2f8[0] = (_Alloc_hider)0x0;
  stack0xfffffffffffffd09 = 0;
  gtest_msg_1.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_1.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_2f8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_2f8);
  if (bVar1) {
    e_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      estl::vector_s<unsigned_int,_5UL>::at((vector_s<unsigned_int,_5UL> *)local_1d8,5);
    }
    if ((e_1._7_1_ & 1) != 0) goto LAB_001240df;
    std::__cxx11::string::operator=
              ((string *)auStack_2f8,
               "Expected: vc.at(5) throws an exception of type std::out_of_range.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_338);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_340,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
             ,0x15e,pcVar3);
  testing::internal::AssertHelper::operator=(&local_340,local_338);
  testing::internal::AssertHelper::~AssertHelper(&local_340);
  testing::Message::~Message(local_338);
LAB_001240df:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_2f8);
  estl::vector_s<unsigned_int,_5UL>::~vector_s((vector_s<unsigned_int,_5UL> *)local_1d8);
  estl::vector_s<unsigned_int,_5UL>::~vector_s((vector_s<unsigned_int,_5UL> *)local_38);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, element_access_at)
{
    vector_s<unsigned, 5> v{0u,1u,2u,3u,4u};
    EXPECT_EQ(0u, v.at(0));
    EXPECT_EQ(1u, v.at(1));
    EXPECT_EQ(2u, v.at(2));
    EXPECT_EQ(3u, v.at(3));
    EXPECT_EQ(4u, v.at(4));
    EXPECT_THROW(v.at(5), std::out_of_range);

    // const variant of at()
    const vector_s<unsigned, 5> vc{0u,1u,2u,3u,4u};
    EXPECT_EQ(0u, vc.at(0));
    EXPECT_EQ(1u, vc.at(1));
    EXPECT_EQ(2u, vc.at(2));
    EXPECT_EQ(3u, vc.at(3));
    EXPECT_EQ(4u, vc.at(4));
    EXPECT_THROW(vc.at(5), std::out_of_range);
}